

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_FabSet.cpp
# Opt level: O0

FabSet * __thiscall
amrex::FabSet::linComb(FabSet *this,Real a,Real b,FabSet *src,int scomp,int dcomp,int ncomp)

{
  int iVar1;
  bool bVar2;
  int in_ECX;
  int in_EDX;
  FabSet *in_RDI;
  int in_R8D;
  pointer in_XMM0_Qa;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *in_XMM1_Qa;
  int i;
  int j;
  int k;
  int n;
  Dim3 amrex_i_hi;
  Dim3 amrex_i_lo;
  Array4<double> dstfab;
  Array4<const_double> srcfab;
  Box *bx;
  FabSetIter fsi;
  FabSet *in_stack_fffffffffffffd68;
  PCData<amrex::FArrayBox> *mfi;
  FabSetIter *in_stack_fffffffffffffd70;
  FabSet *this_00;
  int in_stack_fffffffffffffd80;
  uint in_stack_fffffffffffffd84;
  uint uVar3;
  int local_278;
  int local_274;
  FArrayBox *local_230;
  long local_228;
  long local_220;
  long local_218;
  int local_210;
  int local_20c;
  int local_208;
  long local_1f0;
  long local_1e8;
  long local_1e0;
  long local_1d8;
  int local_1d0;
  int local_1cc;
  int local_1c8;
  undefined1 local_1ac [36];
  undefined1 local_188 [172];
  int local_dc;
  uint uStack_d8;
  int local_d4;
  _Bit_pointer local_d0;
  int local_c8;
  PCData<amrex::FArrayBox> *local_c0;
  int local_b4;
  int iStack_b0;
  int local_ac;
  int local_a8;
  int local_a4;
  uint local_a0;
  int local_9c;
  unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
  local_98;
  int local_90;
  int local_8c;
  uint local_88;
  int local_84;
  FArrayBox **local_80;
  int local_78;
  int local_74;
  uint local_70;
  int local_6c;
  FArrayBox **local_68;
  undefined4 local_5c;
  MultiArray4<const_double> local_58;
  undefined4 local_4c;
  pointer local_48;
  undefined4 local_3c;
  int *local_38;
  undefined4 local_2c;
  PCData<amrex::FArrayBox> *local_28;
  undefined4 local_1c;
  unique_ptr<amrex::PCData<amrex::FArrayBox>,_std::default_delete<amrex::PCData<amrex::FArrayBox>_>_>
  local_18;
  undefined4 local_c;
  PCData<amrex::FArrayBox> *local_8;
  
  local_188._100_4_ = in_R8D;
  local_188._104_4_ = in_ECX;
  local_188._108_4_ = in_EDX;
  local_188._120_8_ = in_XMM1_Qa;
  local_188._128_8_ = in_XMM0_Qa;
  FabSetIter::FabSetIter(in_stack_fffffffffffffd70,in_stack_fffffffffffffd68);
  while (bVar2 = MFIter::isValid((MFIter *)local_188), bVar2) {
    mfi = (PCData<amrex::FArrayBox> *)local_1ac;
    this_00 = (FabSet *)local_188;
    MFIter::validbox((MFIter *)CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80));
    local_1ac._28_8_ = mfi;
    array(this_00,(MFIter *)mfi);
    array(this_00,(MFIter *)mfi);
    local_188._160_8_ = local_1ac._28_8_;
    local_8 = (PCData<amrex::FArrayBox> *)local_1ac._28_8_;
    local_c = 0;
    local_dc = *(int *)&(((unique_ptr<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>
                           *)local_1ac._28_8_)->_M_t).
                        super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>
                        .super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl;
    local_18._M_t.
    super___uniq_ptr_impl<amrex::PCData<amrex::FArrayBox>,_std::default_delete<amrex::PCData<amrex::FArrayBox>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_amrex::PCData<amrex::FArrayBox>_*,_std::default_delete<amrex::PCData<amrex::FArrayBox>_>_>
    .super__Head_base<0UL,_amrex::PCData<amrex::FArrayBox>_*,_false>._M_head_impl =
         (__uniq_ptr_data<amrex::PCData<amrex::FArrayBox>,_std::default_delete<amrex::PCData<amrex::FArrayBox>_>,_true,_true>
          )(__uniq_ptr_data<amrex::PCData<amrex::FArrayBox>,_std::default_delete<amrex::PCData<amrex::FArrayBox>_>,_true,_true>
            )local_1ac._28_8_;
    local_1c = 1;
    uStack_d8 = *(uint *)((long)&(((unique_ptr<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>
                                    *)local_1ac._28_8_)->_M_t).
                                 super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>
                                 .super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl +
                         4);
    local_188._144_8_ =
         (((unique_ptr<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_> *)
          local_1ac._28_8_)->_M_t).
         super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
         super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
         super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl;
    local_28 = (PCData<amrex::FArrayBox> *)local_1ac._28_8_;
    local_2c = 2;
    local_188._152_4_ = *(undefined4 *)(local_1ac._28_8_ + 8);
    local_c0 = (PCData<amrex::FArrayBox> *)local_1ac._28_8_;
    local_38 = (int *)((long)(local_1ac._28_8_ + 8) + 4);
    local_3c = 0;
    local_b4 = *local_38;
    local_48 = (pointer)((long)(local_1ac._28_8_ + 8) + 4);
    local_4c = 1;
    iStack_b0 = ((IntVect *)(local_1ac._28_8_ + 0x10))->vect[0];
    local_d0 = *(_Bit_pointer *)local_38;
    local_58.hp = (Array4<const_double> *)((long)(local_1ac._28_8_ + 8) + 4);
    local_5c = 2;
    local_c8 = *(int *)(local_1ac._28_8_ + 0x14);
    for (local_274 = 0; local_278 = local_188._152_4_, local_274 < (int)local_188._100_4_;
        local_274 = local_274 + 1) {
      for (; uVar3 = uStack_d8, local_278 <= local_c8; local_278 = local_278 + 1) {
        for (; iVar1 = local_dc, (int)uVar3 <= iStack_b0; uVar3 = uVar3 + 1) {
          while (in_stack_fffffffffffffd80 = iVar1, in_stack_fffffffffffffd80 <= local_b4) {
            local_74 = local_278;
            local_78 = local_274 + local_188._104_4_;
            local_68 = &local_230;
            local_a4 = local_278;
            local_a8 = local_274 + local_188._108_4_;
            local_98._M_t.
            super___uniq_ptr_impl<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
            .super__Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false>._M_head_impl =
                 (__uniq_ptr_data<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>,_true,_true>
                  )&local_1f0;
            local_8c = local_278;
            local_90 = local_274 + local_188._104_4_;
            local_80 = &local_230;
            *(double *)
             ((long)(&(local_230->super_BaseFab<double>).domain.smallend + -2) +
             ((long)(in_stack_fffffffffffffd80 - local_210) + (int)(uVar3 - local_20c) * local_228 +
              (local_278 - local_208) * local_220 + local_90 * local_218) * 8) =
                 (double)local_188._128_8_ *
                 *(double *)
                  ((long)(&(local_230->super_BaseFab<double>).domain.smallend + -2) +
                  ((long)(in_stack_fffffffffffffd80 - local_210) +
                   (int)(uVar3 - local_20c) * local_228 + (local_278 - local_208) * local_220 +
                  local_78 * local_218) * 8) +
                 (double)local_188._120_8_ *
                 *(double *)
                  (local_1f0 +
                  ((long)(in_stack_fffffffffffffd80 - local_1d0) +
                   (int)(uVar3 - local_1cc) * local_1e8 + (local_278 - local_1c8) * local_1e0 +
                  local_a8 * local_1d8) * 8);
            local_a0 = uVar3;
            local_9c = in_stack_fffffffffffffd80;
            local_88 = uVar3;
            local_84 = in_stack_fffffffffffffd80;
            local_70 = uVar3;
            local_6c = in_stack_fffffffffffffd80;
            iVar1 = in_stack_fffffffffffffd80 + 1;
          }
        }
        in_stack_fffffffffffffd84 = uVar3;
      }
    }
    local_d4 = local_188._152_4_;
    local_ac = local_c8;
    MFIter::operator++((MFIter *)local_188);
  }
  FabSetIter::~FabSetIter((FabSetIter *)0x10528d7);
  return in_RDI;
}

Assistant:

FabSet&
FabSet::linComb (Real a, Real b, const FabSet& src, int scomp, int dcomp, int ncomp)
{
    BL_ASSERT(size() == src.size());

#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
    for (FabSetIter fsi(*this); fsi.isValid(); ++fsi)
    {
        const Box& bx = fsi.validbox();
        auto const srcfab =   src.array(fsi);
        auto       dstfab = this->array(fsi);
        AMREX_HOST_DEVICE_PARALLEL_FOR_4D ( bx, ncomp, i, j, k, n,
        {
            dstfab(i,j,k,n+dcomp) = a*dstfab(i,j,k,n+dcomp) + b*srcfab(i,j,k,n+scomp);
        });
    }
    return *this;
}